

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

FeatureOptions<wasm::Type> * __thiscall
wasm::Random::FeatureOptions<wasm::Type>::
add<wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type>
          (FeatureOptions<wasm::Type> *this,FeatureSet feature,Type option,Type rest,Type rest_1,
          Type rest_2,Type rest_3,Type rest_4,Type rest_5)

{
  mapped_type *this_00;
  FeatureOptions<wasm::Type> *pFVar1;
  FeatureOptions<wasm::Type> *this_local;
  Type rest_local_5;
  Type rest_local_4;
  Type rest_local_3;
  Type rest_local_2;
  Type rest_local_1;
  Type rest_local;
  Type option_local;
  FeatureSet feature_local;
  
  rest_local = option;
  option_local.id._4_4_ = feature.features;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
            ::operator[](&this->options,(key_type *)((long)&option_local.id + 4));
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back(this_00,&rest_local);
  pFVar1 = add<wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type>
                     (this,option_local.id._4_4_,rest,rest_1,rest_2,rest_3,rest_4,rest_5);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }